

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

void mbedtls_mpi_swap(mbedtls_mpi *X,mbedtls_mpi *Y)

{
  mbedtls_mpi_uint *pmVar1;
  unsigned_short uVar2;
  undefined4 uVar3;
  short sVar4;
  unsigned_short uVar5;
  undefined4 uVar6;
  mbedtls_mpi T;
  mbedtls_mpi *Y_local;
  mbedtls_mpi *X_local;
  
  pmVar1 = X->p;
  sVar4 = X->s;
  uVar5 = X->n;
  uVar6 = *(undefined4 *)&X->field_0xc;
  X->p = Y->p;
  uVar2 = Y->n;
  uVar3 = *(undefined4 *)&Y->field_0xc;
  X->s = Y->s;
  X->n = uVar2;
  *(undefined4 *)&X->field_0xc = uVar3;
  Y->p = pmVar1;
  Y->s = sVar4;
  Y->n = uVar5;
  *(undefined4 *)&Y->field_0xc = uVar6;
  return;
}

Assistant:

void mbedtls_mpi_swap(mbedtls_mpi *X, mbedtls_mpi *Y)
{
    mbedtls_mpi T;
    MPI_VALIDATE(X != NULL);
    MPI_VALIDATE(Y != NULL);

    memcpy(&T,  X, sizeof(mbedtls_mpi));
    memcpy(X,  Y, sizeof(mbedtls_mpi));
    memcpy(Y, &T, sizeof(mbedtls_mpi));
}